

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envelope.cc
# Opt level: O0

void __thiscall EnvelopeGenerator::reset(EnvelopeGenerator *this)

{
  EnvelopeGenerator *this_local;
  
  this->envelope_counter = 0;
  this->attack = 0;
  this->decay = 0;
  this->sustain = 0;
  this->release = 0;
  this->gate = 0;
  this->rate_counter = 0;
  this->exponential_counter = 0;
  this->exponential_counter_period = 1;
  this->state = RELEASE;
  this->rate_period = rate_counter_period[this->release];
  this->hold_zero = true;
  return;
}

Assistant:

void EnvelopeGenerator::reset()
{
  envelope_counter = 0;

  attack = 0;
  decay = 0;
  sustain = 0;
  release = 0;

  gate = 0;

  rate_counter = 0;
  exponential_counter = 0;
  exponential_counter_period = 1;

  state = RELEASE;
  rate_period = rate_counter_period[release];
  hold_zero = true;
}